

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace_impl.cc
# Opt level: O0

bool __thiscall
webrtc::TraceImpl::UpdateFileName
          (TraceImpl *this,char *file_name_utf8,char *file_name_with_counter_utf8,uint32_t new_count
          )

{
  int iVar1;
  size_t sVar2;
  int local_38;
  int local_34;
  int32_t length_to_;
  int32_t length_without_file_ending;
  int32_t length;
  uint32_t new_count_local;
  char *file_name_with_counter_utf8_local;
  char *file_name_utf8_local;
  TraceImpl *this_local;
  
  sVar2 = strlen(file_name_utf8);
  iVar1 = (int)sVar2;
  local_34 = iVar1;
  if (iVar1 < 0) {
    this_local._7_1_ = false;
  }
  else {
    do {
      local_34 = local_34 + -1;
      if (local_34 < 1) break;
    } while (file_name_utf8[local_34] != '.');
    local_38 = local_34;
    if (local_34 == 0) {
      local_38 = iVar1;
      local_34 = iVar1;
    }
    do {
      local_38 = local_38 + -1;
      if (local_38 < 1) break;
    } while (file_name_utf8[local_38] != '_');
    memcpy(file_name_with_counter_utf8,file_name_utf8,(long)local_38);
    sprintf(file_name_with_counter_utf8 + local_38,"_%lu%s",(ulong)new_count,
            file_name_utf8 + local_34);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool TraceImpl::UpdateFileName(
    const char file_name_utf8[FileWrapper::kMaxFileNameSize],
    char file_name_with_counter_utf8[FileWrapper::kMaxFileNameSize],
    const uint32_t new_count) const {
  int32_t length = (int32_t)strlen(file_name_utf8);
  if (length < 0) {
    return false;
  }

  int32_t length_without_file_ending = length - 1;
  while (length_without_file_ending > 0) {
    if (file_name_utf8[length_without_file_ending] == '.') {
      break;
    } else {
      length_without_file_ending--;
    }
  }
  if (length_without_file_ending == 0) {
    length_without_file_ending = length;
  }
  int32_t length_to_ = length_without_file_ending - 1;
  while (length_to_ > 0) {
    if (file_name_utf8[length_to_] == '_') {
      break;
    } else {
      length_to_--;
    }
  }

  memcpy(file_name_with_counter_utf8, file_name_utf8, length_to_);
  sprintf(file_name_with_counter_utf8 + length_to_, "_%lu%s",
          static_cast<long unsigned int>(new_count),
          file_name_utf8 + length_without_file_ending);
  return true;
}